

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true>::
ConvertToTypeHandler<Js::SimpleDictionaryUnorderedTypeHandler<int,Js::PropertyRecord_const*,true>,Js::PropertyRecord_const*>
          (SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> *this,
          DynamicObject *instance)

{
  char cVar1;
  SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,true> SVar2;
  Type TVar3;
  Recycler *this_00;
  DynamicType *oldType;
  Type *pTVar4;
  SimpleDictionaryPropertyDescriptor<int> SVar5;
  JavascriptString *propertyString;
  code *pcVar6;
  undefined8 scriptContext;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  PropertyTypes values;
  Recycler *alloc;
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *this_01;
  undefined4 *puVar10;
  RecyclerWeakReference<Js::DynamicObject> *oldSingletonInstanceBefore;
  RecyclerWeakReference<Js::DynamicObject> *instance_00;
  SimpleDictionaryPropertyDescriptor<int> *pSVar11;
  JavascriptString **ppJVar12;
  int index;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_02;
  int iVar13;
  undefined1 local_a0 [8];
  TrackAllocData data;
  bool local_31;
  
  data._32_8_ = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                super_JavascriptLibraryBase).scriptContext.ptr;
  this_00 = ((ScriptContext *)data._32_8_)->recycler;
  local_a0 = (undefined1  [8])
             &SimpleDictionaryUnorderedTypeHandler<int,Js::PropertyRecord_const*,true>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9ef1b8b;
  data.filename._0_4_ = 0x1b2;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_a0);
  this_01 = (SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true> *)
            new<Memory::Recycler>(0x38,alloc,0x38bbb2);
  SimpleDictionaryUnorderedTypeHandler<int,_const_Js::PropertyRecord_*,_true>::
  SimpleDictionaryUnorderedTypeHandler
            (this_01,this_00,*(int *)(this + 0xc),*(uint16 *)(this + 0x12),*(uint16 *)(this + 10));
  bVar7 = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this_01);
  if ((bVar7 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1b4,"(newTypeHandler->GetHasOnlyWritableDataProperties())",
                                "newTypeHandler->GetHasOnlyWritableDataProperties()");
    if (!bVar8) goto LAB_00e4a3de;
    *puVar10 = 0;
  }
  oldType = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
  oldSingletonInstanceBefore =
       SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::GetSingletonInstance
                 ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *)this);
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
  TraceFixedFieldsBeforeTypeHandlerChange
            (L"SimpleDictionaryTypeHandler",L"[Simple]DictionaryTypeHandler",instance,
             (DynamicTypeHandler *)this,oldType,oldSingletonInstanceBefore);
  bVar8 = DynamicTypeHandler::CanBeSingletonInstance(instance);
  if (bVar8) {
LAB_00e49ea9:
    bVar8 = DynamicTypeHandler::ShouldFixAnyProperties();
    if ((!bVar8) && (*(long *)(this + 0x20) != 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x1c4,"(HasSingletonInstanceOnlyIfNeeded())",
                                  "HasSingletonInstanceOnlyIfNeeded()");
      if (!bVar8) goto LAB_00e4a3de;
      *puVar10 = 0;
    }
    bVar8 = DynamicTypeHandler::ShouldFixAnyProperties();
    if (bVar8) {
      instance_00 = *(RecyclerWeakReference<Js::DynamicObject> **)(this + 0x20);
      if ((instance_00 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) ||
         ((DynamicObject *)(instance_00->super_RecyclerWeakReferenceBase).strongRef != instance)) {
        instance_00 = DynamicObject::CreateWeakReferenceToSelf(instance);
      }
      DynamicTypeHandler::SetSingletonInstance((DynamicTypeHandler *)this_01,instance_00);
    }
  }
  else {
    if (*(long *)(this + 0x20) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                  ,0x1bf,"(canBeSingletonInstance || !this->HasSingletonInstance())"
                                  ,"canBeSingletonInstance || !this->HasSingletonInstance()");
      if (!bVar9) goto LAB_00e4a3de;
      *puVar10 = 0;
    }
    if (bVar8) goto LAB_00e49ea9;
  }
  pTVar4 = (instance->super_RecyclableObject).type.ptr;
  TVar3 = pTVar4->typeId;
  cVar1 = *(char *)&pTVar4[1].javascriptLibrary.ptr;
  SVar2 = this[9];
  if (((((byte)SVar2 & 0x18) != 0) && (((byte)SVar2 & 0x20) != 0)) && (DAT_015d6345 != '\0')) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1d8,
                                "(!isOrMayBecomeShared || !IsolatePrototypes() || ((this->GetFlags() & IsPrototypeFlag) == 0))"
                                ,
                                "!isOrMayBecomeShared || !IsolatePrototypes() || ((this->GetFlags() & IsPrototypeFlag) == 0)"
                               );
    if (!bVar8) goto LAB_00e4a3de;
    *puVar10 = 0;
  }
  local_31 = true;
  if (((TVar3 != TypeIds_GlobalObject) && (cVar1 != '\0')) &&
     ((((byte)this[9] & 0x20) == 0 && ((((byte)SVar2 & 0x18) == 0 || (DAT_015d6345 == '\x01')))))) {
    local_31 = Phases::IsEnabled((Phases *)&DAT_015b0240,FixDataPropsPhase);
  }
  this_02 = *(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
              **)(this + 0x18);
  if (0 < this_02->count - this_02->freeCount) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    index = 0;
    do {
      pSVar11 = JsUtil::
                BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                ::GetValueAt(this_02,index);
      SVar5 = *pSVar11;
      ppJVar12 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetKeyAt(*(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                              **)(this + 0x18),index);
      propertyString = *ppJVar12;
      iVar13 = SVar5.propertyIndex;
      if ((this_01->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
          nextPropertyIndex < iVar13) {
        (this_01->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
        nextPropertyIndex = iVar13;
      }
      if ((this_01->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
          nextPropertyIndex != iVar13) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x1ec,
                                    "(newTypeHandler->nextPropertyIndex == descriptor.propertyIndex)"
                                    ,"newTypeHandler->nextPropertyIndex == descriptor.propertyIndex"
                                   );
        if (!bVar8) goto LAB_00e4a3de;
        *puVar10 = 0;
      }
      bVar7 = SVar5._0_1_;
      if ((((byte)this[9] & 0x10) != 0) && (((ulong)SVar5 & 4) != 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar10 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                    ,0x1ee,"(!GetIsShared() || !descriptor.isFixed)",
                                    "!GetIsShared() || !descriptor.isFixed");
        if (!bVar8) goto LAB_00e4a3de;
        *puVar10 = 0;
      }
      scriptContext = data._32_8_;
      ScriptContext::GetOrAddPropertyRecord
                ((ScriptContext *)data._32_8_,propertyString,(PropertyRecord **)local_a0);
      SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true>::
      Add<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<int,Js::PropertyRecord_const*,true> *)this_01,
                 (PropertyRecord *)local_a0,SVar5.Attributes,(bool)((bVar7 & 2) >> 1),
                 (bool)((bVar7 & 4) >> 2),(bool)((bVar7 & 8) >> 3 & local_31),
                 (ScriptContext *)scriptContext);
      index = index + 1;
      this_02 = *(BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                  **)(this + 0x18);
    } while (index < this_02->count - this_02->freeCount);
  }
  (this_01->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
  nextPropertyIndex = *(Type *)(this + 0x2c);
  (this_01->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
  numDeletedProperties = (Type)this[0x29];
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::ClearSingletonInstance
            ((SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *)this);
  if (((this_01->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
       super_DynamicTypeHandler.flags & 0x20) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x1fc,"((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0)",
                                "Why did we create a brand new type handler with a prototype flag set?"
                               );
    if (!bVar8) goto LAB_00e4a3de;
    *puVar10 = 0;
  }
  DynamicTypeHandler::SetFlags((DynamicTypeHandler *)this_01,(byte)this[9] & 0x20);
  DynamicTypeHandler::ChangeFlags((DynamicTypeHandler *)this_01,0xc1,(BYTE)this[9]);
  if (((this_01->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
       super_DynamicTypeHandler.propertyTypes & 0x40) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x201,"(newTypeHandler->GetIsInlineSlotCapacityLocked())",
                                "newTypeHandler->GetIsInlineSlotCapacityLocked()");
    if (!bVar8) goto LAB_00e4a3de;
    *puVar10 = 0;
  }
  values = DynamicTypeHandler::GetPropertyTypes((DynamicTypeHandler *)this);
  DynamicTypeHandler::SetPropertyTypes((DynamicTypeHandler *)this_01,0xb0,values);
  DynamicTypeHandler::SetInstanceTypeHandler((DynamicTypeHandler *)this_01,instance,true);
  if ((local_31 == false) &&
     (((DynamicType *)(instance->super_RecyclableObject).type.ptr == oldType ||
      ((oldType->super_Type).typeId == TypeIds_GlobalObject)))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x206,
                                "(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject))"
                                ,
                                "transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject)"
                               );
    if (!bVar8) goto LAB_00e4a3de;
    *puVar10 = 0;
  }
  if (((this_01->super_SimpleDictionaryTypeHandlerBase<int,_const_Js::PropertyRecord_*,_true>).
       singletonInstance.ptr != (RecyclerWeakReference<Js::DynamicObject> *)0x0) &&
     (bVar8 = DynamicObject::HasSharedType(instance), bVar8)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x207,
                                "(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType())"
                                ,
                                "!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType()"
                               );
    if (!bVar8) {
LAB_00e4a3de:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar10 = 0;
  }
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::
  TraceFixedFieldsAfterTypeHandlerChange
            (instance,(DynamicTypeHandler *)this,(DynamicTypeHandler *)this_01,oldType,
             oldSingletonInstanceBefore);
  return this_01;
}

Assistant:

U* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeHandler(DynamicObject* instance)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        U* newTypeHandler = RecyclerNew(recycler, U, recycler, GetSlotCapacity(), GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
        // We expect the new type handler to start off marked as having only writable data properties.
        Assert(newTypeHandler->GetHasOnlyWritableDataProperties());

#if ENABLE_FIXED_FIELDS
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        DynamicType* oldType = instance->GetDynamicType();
        RecyclerWeakReference<DynamicObject>* oldSingletonInstance = GetSingletonInstance();
        TraceFixedFieldsBeforeTypeHandlerChange(_u("SimpleDictionaryTypeHandler"), _u("[Simple]DictionaryTypeHandler"), instance, this, oldType, oldSingletonInstance);
#endif

        bool const canBeSingletonInstance = DynamicTypeHandler::CanBeSingletonInstance(instance);
        // If this type had been installed on a stack instance it shouldn't have a singleton Instance
        Assert(canBeSingletonInstance || !this->HasSingletonInstance());

        if (canBeSingletonInstance)
        {
            // We assume the new type handler is not shared.  Hence it's ok to set this instance as the handler's singleton instance.
            Assert(HasSingletonInstanceOnlyIfNeeded());
            if (AreSingletonInstancesNeeded())
            {
                RecyclerWeakReference<DynamicObject>* curSingletonInstance = this->singletonInstance;
                if (curSingletonInstance != nullptr && curSingletonInstance->Get() == instance)
                {
                    newTypeHandler->SetSingletonInstance(curSingletonInstance);
                }
                else
                {
                    newTypeHandler->SetSingletonInstance(instance->CreateWeakReferenceToSelf());
                }
            }
        }

        // If we are a prototype or may become a prototype we must transfer used as fixed bits.
        // See point 4 in PathTypeHandlerBase::ConvertToSimpleDictionaryType.
        bool isGlobalObject = instance->GetTypeId() == TypeIds_GlobalObject;
        bool isTypeLocked = instance->GetDynamicType()->GetIsLocked();
        bool isOrMayBecomeShared = GetIsOrMayBecomeShared();
        Assert(!isOrMayBecomeShared || !IsolatePrototypes() || ((this->GetFlags() & IsPrototypeFlag) == 0));
        // For the global object we don't emit a type check before a hard-coded use of a fixed field. Therefore a type transition isn't sufficient to
        // invalidate any used fixed fields, and we must continue tracking them on the new type handler. If the type isn't locked, we may not change the
        // type of the instance, and we must also track the used fixed fields on the new handler.
        bool transferUsedAsFixed = isGlobalObject || !isTypeLocked || ((this->GetFlags() & IsPrototypeFlag) != 0 || (isOrMayBecomeShared && !IsolatePrototypes())) || PHASE_FORCE1(Js::FixDataPropsPhase);
#endif

        SimpleDictionaryPropertyDescriptor<TPropertyIndex> descriptor;
        TMapKey propertyKey;
        for (int i = 0; i < propertyMap->Count(); i++)
        {
            descriptor = propertyMap->GetValueAt(i);
            propertyKey = propertyMap->GetKeyAt(i);

            // newTH->nextPropertyIndex will be less than desc.propertyIndex, when we have function with same name parameters
            if (newTypeHandler->nextPropertyIndex < static_cast<typename U::PropertyIndexType>(descriptor.propertyIndex))
            {
                newTypeHandler->nextPropertyIndex = static_cast<typename U::PropertyIndexType>(descriptor.propertyIndex);
            }

            Assert(newTypeHandler->nextPropertyIndex == descriptor.propertyIndex);
#if ENABLE_FIXED_FIELDS
            Assert(!GetIsShared() || !descriptor.isFixed);
            newTypeHandler->Add(TMapKey_ConvertKey<UMapKey>(scriptContext, propertyKey), descriptor.Attributes, descriptor.isInitialized, descriptor.isFixed, transferUsedAsFixed && descriptor.usedAsFixed, scriptContext);
#else
            newTypeHandler->Add(TMapKey_ConvertKey<UMapKey>(scriptContext, propertyKey), descriptor.Attributes, true, false, false, scriptContext);
#endif
        }

        newTypeHandler->nextPropertyIndex = static_cast<typename U::PropertyIndexType>(nextPropertyIndex);
        newTypeHandler->SetNumDeletedProperties(numDeletedProperties);

#if ENABLE_FIXED_FIELDS
        ClearSingletonInstance();
#endif

        AssertMsg((newTypeHandler->GetFlags() & IsPrototypeFlag) == 0, "Why did we create a brand new type handler with a prototype flag set?");
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        newTypeHandler->ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag, this->GetFlags());
        // Any new type handler we expect to see here should have inline slot capacity locked.  If this were to change, we would need
        // to update our shrinking logic (see PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity).
        Assert(newTypeHandler->GetIsInlineSlotCapacityLocked());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        newTypeHandler->SetInstanceTypeHandler(instance);
#if ENABLE_FIXED_FIELDS
        // We assumed that we don't need to transfer used as fixed bits unless we are a prototype, which is only valid if we also changed the type.
        Assert(transferUsedAsFixed || (instance->GetType() != oldType && oldType->GetTypeId() != TypeIds_GlobalObject));
        Assert(!newTypeHandler->HasSingletonInstance() || !instance->HasSharedType());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        TraceFixedFieldsAfterTypeHandlerChange(instance, this, newTypeHandler, oldType, oldSingletonInstance);
#endif
#endif
        return newTypeHandler;
    }